

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void cppurses::output::put(Glyph *g)

{
  Glyph *g_local;
  
  anon_unknown.dwarf_1b86b7::put_as_wchar(g);
  return;
}

Assistant:

void put(const Glyph& g) {
#ifdef SLOW_PAINT
    paint_indicator('X');
#endif
#ifdef add_wchstr
    put_as_wchar(g);
#else  // If no wchar_t support in ncurses.
    put_as_char(g);
#endif
#ifdef SLOW_PAINT
    refresh();
    std::this_thread::sleep_for(std::chrono::milliseconds(SLOW_PAINT));
#endif
}